

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_hpf1_get_heap_size(ma_hpf1_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_result mVar1;
  ma_hpf1_heap_layout heapLayout;
  
  if (pHeapSizeInBytes != (size_t *)0x0) {
    mVar1 = ma_hpf1_get_heap_layout(pConfig,&heapLayout);
    if (mVar1 == MA_SUCCESS) {
      *pHeapSizeInBytes = heapLayout.sizeInBytes;
      mVar1 = MA_SUCCESS;
    }
    return mVar1;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_hpf1_get_heap_size(const ma_hpf1_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_hpf1_heap_layout heapLayout;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_hpf1_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    *pHeapSizeInBytes = heapLayout.sizeInBytes;

    return MA_SUCCESS;
}